

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O3

void amrex::EB_average_down_faces
               (Array<const_MultiFab_*,_3> *fine,Array<MultiFab_*,_3> *crse,IntVect *ratio,
               int ngcrse)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  _Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false> _Var6;
  MultiFab *pMVar7;
  MultiFab *pMVar8;
  FabArray<amrex::FArrayBox> *this;
  bool bVar9;
  FabType FVar10;
  long lVar11;
  EBCellFlagFab *this_00;
  long lVar12;
  long lVar13;
  double *pdVar14;
  Periodicity *period;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  double *pdVar22;
  uint uVar23;
  int iVar24;
  double *pdVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  MFIter *pMVar30;
  FabArray<amrex::FArrayBox> *src;
  int idim;
  int iVar31;
  double *pdVar32;
  double dVar33;
  double dVar34;
  ulong local_6e0;
  ulong local_6b8;
  long local_6a8;
  long local_690;
  int jj;
  int local_640;
  undefined1 local_618 [24];
  long local_600;
  Dim3 aDStack_5f8 [2];
  ulong local_5d8;
  Array<const_MultiFab_*,_3> *local_5d0;
  IntVect *local_5c8;
  ulong local_5c0;
  Box local_5b4;
  Box result;
  undefined4 uStack_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  Array4<const_double> local_508;
  undefined8 local_4c8 [3];
  MFIter mfi;
  undefined1 local_330 [384];
  undefined1 local_1b0 [384];
  
  _Var6._M_head_impl =
       (fine->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
       super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  local_5d0 = fine;
  local_5c8 = ratio;
  if (_Var6._M_head_impl != (FabFactory<amrex::FArrayBox> *)0x0) {
    uVar20 = (ulong)(uint)(crse->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          n_comp;
    lVar11 = __dynamic_cast(_Var6._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    if (lVar11 != 0) {
      iVar2 = local_5c8->vect[0];
      iVar3 = local_5c8->vect[1];
      iVar4 = local_5c8->vect[2];
      lVar11 = __dynamic_cast(_Var6._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo);
      if (lVar11 == 0) {
        __cxa_bad_cast();
      }
      EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar11 + 0xd8));
      pMVar7 = local_5d0->_M_elems[0];
      pMVar8 = crse->_M_elems[0];
      bVar9 = DistributionMapping::operator==
                        (&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          distributionMap,
                         &(pMVar8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          distributionMap);
      local_5d8 = uVar20;
      if ((bVar9) &&
         ((pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (pMVar8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
        lVar11 = 0;
        do {
          MFIter::MFIter(&mfi,(FabArrayBase *)crse->_M_elems[lVar11],true);
          while (mfi.currentIndex < mfi.endIndex) {
            iVar19 = mfi.currentIndex;
            if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              iVar19 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[mfi.currentIndex];
            }
            this_00 = getEBCellFlagFab((local_5d0->_M_elems[lVar11]->
                                       super_FabArray<amrex::FArrayBox>).m_fabs_v.
                                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[iVar19]);
            MFIter::growntilebox(&local_5b4,&mfi,ngcrse);
            result.smallend.vect[1] = local_5b4.smallend.vect[1];
            result.smallend.vect[0] = local_5b4.smallend.vect[0];
            result.bigend.vect[1] = local_5b4.bigend.vect[1];
            result.bigend.vect[2] = local_5b4.bigend.vect[2];
            result.btype.itype = local_5b4.btype.itype;
            result.smallend.vect[2] = local_5b4.smallend.vect[2];
            result.bigend.vect[0] = local_5b4.bigend.vect[0];
            iVar19 = local_5c8->vect[0];
            iVar31 = local_5c8->vect[1];
            iVar24 = local_5c8->vect[2];
            if (iVar24 != 1 || (iVar31 != 1 || iVar19 != 1)) {
              uVar16 = (uint)((local_5b4.btype.itype & 2) == 0);
              result.smallend.vect[1] = local_5b4.smallend.vect[1] * iVar31;
              result.smallend.vect[0] = local_5b4.smallend.vect[0] * iVar19;
              result.smallend.vect[2] = local_5b4.smallend.vect[2] * iVar24;
              uVar23 = (uint)((local_5b4.btype.itype & 4) == 0);
              result.bigend.vect[0] =
                   (local_5b4.bigend.vect[0] + (~local_5b4.btype.itype & 1)) * iVar19 -
                   (~local_5b4.btype.itype & 1);
              result.bigend.vect[1] = (local_5b4.bigend.vect[1] + uVar16) * iVar31 - uVar16;
              result.bigend.vect[2] = (local_5b4.bigend.vect[2] + uVar23) * iVar24 - uVar23;
            }
            FVar10 = EBCellFlagFab::getType(this_00,&result);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&result,
                       &crse->_M_elems[lVar11]->super_FabArray<amrex::FArrayBox>,&mfi);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)local_618,
                       &local_5d0->_M_elems[lVar11]->super_FabArray<amrex::FArrayBox>,&mfi);
            iVar19 = (int)lVar11;
            if ((uint)(FVar10 + singlevalued) < 2) {
              lVar12 = (long)local_5b4.smallend.vect[0];
              lVar13 = (long)local_5b4.smallend.vect[1];
              uVar16 = local_5c8->vect[0];
              uVar23 = local_5c8->vect[1];
              uVar5 = local_5c8->vect[2];
              iVar31 = (int)uVar20;
              if (iVar19 == 0) {
                if (0 < iVar31) {
                  local_6b8 = 0;
                  do {
                    local_690 = (long)local_5b4.smallend.vect[2];
                    if (local_5b4.smallend.vect[2] <= local_5b4.bigend.vect[2]) {
                      do {
                        if (local_5b4.smallend.vect[1] <= local_5b4.bigend.vect[1]) {
                          local_6a8 = lVar13;
                          iVar19 = local_5b4.smallend.vect[1] * uVar23;
                          do {
                            if (local_5b4.smallend.vect[0] <= local_5b4.bigend.vect[0]) {
                              lVar28 = lVar12;
                              do {
                                if ((int)uVar5 < 1) {
                                  dVar33 = 0.0;
                                }
                                else {
                                  dVar33 = 0.0;
                                  uVar20 = 0;
                                  do {
                                    if (0 < (int)uVar23) {
                                      uVar21 = (ulong)uVar23;
                                      iVar31 = iVar19 - aDStack_5f8[0].y;
                                      do {
                                        dVar33 = dVar33 + *(double *)
                                                           (local_618._0_8_ +
                                                           ((lVar28 * (int)uVar16 -
                                                            (long)aDStack_5f8[0].x) +
                                                           local_600 * local_6b8 +
                                                           (long)(int)(((int)uVar20 +
                                                                       (int)local_690 * uVar5) -
                                                                      aDStack_5f8[0].z) *
                                                           local_618._16_8_ +
                                                           local_618._8_8_ * (long)iVar31) * 8);
                                        iVar31 = iVar31 + 1;
                                        uVar21 = uVar21 - 1;
                                      } while (uVar21 != 0);
                                    }
                                    uVar20 = uVar20 + 1;
                                  } while (uVar20 != uVar5);
                                }
                                *(double *)
                                 ((local_690 - (int)local_570) *
                                  CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                  result.smallend.vect._0_8_ +
                                  CONCAT44(uStack_57c,result.btype.itype) * local_6b8 * 8 +
                                  (local_6a8 - (int)local_574) *
                                  CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                 (lVar28 - (int)local_578) * 8) =
                                     dVar33 * (1.0 / (double)(int)(uVar5 * uVar23));
                                lVar28 = lVar28 + 1;
                              } while (local_5b4.bigend.vect[0] + 1U != (int)lVar28);
                            }
                            local_6a8 = local_6a8 + 1;
                            iVar19 = iVar19 + uVar23;
                          } while (local_5b4.bigend.vect[1] + 1U != (int)local_6a8);
                        }
                        local_690 = local_690 + 1;
                      } while (local_5b4.bigend.vect[2] + 1 != (int)local_690);
                    }
                    local_6b8 = local_6b8 + 1;
                    uVar20 = local_5d8;
                  } while (local_6b8 != local_5d8);
                }
              }
              else if (iVar19 == 1) {
                if (0 < iVar31) {
                  local_6e0 = 0;
                  do {
                    local_690 = (long)local_5b4.smallend.vect[2];
                    if (local_5b4.smallend.vect[2] <= local_5b4.bigend.vect[2]) {
                      do {
                        if (local_5b4.smallend.vect[1] <= local_5b4.bigend.vect[1]) {
                          local_6b8 = lVar13;
                          do {
                            if (local_5b4.smallend.vect[0] <= local_5b4.bigend.vect[0]) {
                              lVar28 = lVar12;
                              iVar19 = local_5b4.smallend.vect[0] * uVar16;
                              do {
                                if ((int)uVar5 < 1) {
                                  dVar33 = 0.0;
                                }
                                else {
                                  dVar33 = 0.0;
                                  uVar20 = 0;
                                  do {
                                    if (0 < (int)uVar16) {
                                      uVar21 = (ulong)uVar16;
                                      iVar31 = iVar19 - aDStack_5f8[0].x;
                                      do {
                                        dVar33 = dVar33 + *(double *)
                                                           (local_618._0_8_ +
                                                           ((local_6b8 * (long)(int)uVar23 -
                                                            (long)aDStack_5f8[0].y) *
                                                            local_618._8_8_ +
                                                           local_600 * local_6e0 +
                                                           (long)(int)(((int)local_690 * uVar5 +
                                                                       (int)uVar20) -
                                                                      aDStack_5f8[0].z) *
                                                           local_618._16_8_ + (long)iVar31) * 8);
                                        iVar31 = iVar31 + 1;
                                        uVar21 = uVar21 - 1;
                                      } while (uVar21 != 0);
                                    }
                                    uVar20 = uVar20 + 1;
                                  } while (uVar20 != uVar5);
                                }
                                *(double *)
                                 ((local_690 - (int)local_570) *
                                  CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                  result.smallend.vect._0_8_ +
                                  CONCAT44(uStack_57c,result.btype.itype) * local_6e0 * 8 +
                                  (local_6b8 - (long)(int)local_574) *
                                  CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                 (lVar28 - (int)local_578) * 8) =
                                     dVar33 * (1.0 / (double)(int)(uVar5 * uVar16));
                                lVar28 = lVar28 + 1;
                                iVar19 = iVar19 + uVar16;
                              } while (local_5b4.bigend.vect[0] + 1U != (int)lVar28);
                            }
                            local_6b8 = local_6b8 + 1;
                          } while (local_5b4.bigend.vect[1] + 1U != (int)local_6b8);
                        }
                        local_690 = local_690 + 1;
                      } while (local_5b4.bigend.vect[2] + 1 != (int)local_690);
                    }
                    local_6e0 = local_6e0 + 1;
                    uVar20 = local_5d8;
                  } while (local_6e0 != local_5d8);
                }
              }
              else if ((iVar19 == 2) && (0 < iVar31)) {
                local_6e0 = 0;
                do {
                  iVar19 = local_5b4.smallend.vect[2];
                  if (local_5b4.smallend.vect[2] <= local_5b4.bigend.vect[2]) {
                    do {
                      if (local_5b4.smallend.vect[1] <= local_5b4.bigend.vect[1]) {
                        local_6a8 = lVar13;
                        do {
                          if (local_5b4.smallend.vect[0] <= local_5b4.bigend.vect[0]) {
                            lVar28 = lVar12;
                            iVar31 = uVar16 * local_5b4.smallend.vect[0];
                            do {
                              if ((int)uVar23 < 1) {
                                dVar33 = 0.0;
                              }
                              else {
                                dVar33 = 0.0;
                                uVar20 = 0;
                                do {
                                  if (0 < (int)uVar16) {
                                    uVar21 = (ulong)uVar16;
                                    iVar24 = iVar31 - aDStack_5f8[0].x;
                                    do {
                                      dVar33 = dVar33 + *(double *)
                                                         (local_618._0_8_ +
                                                         (((long)(int)(iVar19 * uVar5) -
                                                          (long)aDStack_5f8[0].z) * local_618._16_8_
                                                         + local_600 * local_6e0 +
                                                           (long)(int)(((int)local_6a8 * uVar23 +
                                                                       (int)uVar20) -
                                                                      aDStack_5f8[0].y) *
                                                           local_618._8_8_ + (long)iVar24) * 8);
                                      iVar24 = iVar24 + 1;
                                      uVar21 = uVar21 - 1;
                                    } while (uVar21 != 0);
                                  }
                                  uVar20 = uVar20 + 1;
                                } while (uVar20 != uVar23);
                              }
                              *(double *)
                               (((long)iVar19 - (long)(int)local_570) *
                                CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                result.smallend.vect._0_8_ +
                                CONCAT44(uStack_57c,result.btype.itype) * local_6e0 * 8 +
                                (local_6a8 - (int)local_574) *
                                CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                               (lVar28 - (int)local_578) * 8) =
                                   dVar33 * (1.0 / (double)(int)(uVar23 * uVar16));
                              lVar28 = lVar28 + 1;
                              iVar31 = iVar31 + uVar16;
                            } while (local_5b4.bigend.vect[0] + 1U != (int)lVar28);
                          }
                          local_6a8 = local_6a8 + 1;
                        } while (local_5b4.bigend.vect[1] + 1U != (int)local_6a8);
                      }
                      bVar9 = iVar19 != local_5b4.bigend.vect[2];
                      iVar19 = iVar19 + 1;
                    } while (bVar9);
                  }
                  local_6e0 = local_6e0 + 1;
                  uVar20 = local_5d8;
                } while (local_6e0 != local_5d8);
              }
            }
            else {
              MultiCutFab::const_array(&local_508,(MultiCutFab *)local_4c8[lVar11],&mfi);
              if (iVar19 == 1) {
                if (local_5b4.smallend.vect[2] <= local_5b4.bigend.vect[2]) {
                  local_5c0 = (ulong)(uint)local_5b4.bigend.vect[0];
                  iVar31 = iVar4 * local_5b4.smallend.vect[2];
                  iVar24 = (local_5b4.smallend.vect[2] + 1) * iVar4;
                  iVar19 = local_5b4.smallend.vect[2];
                  do {
                    lVar12 = (long)iVar31;
                    if (local_5b4.smallend.vect[1] <= local_5b4.bigend.vect[1]) {
                      uVar16 = local_5b4.smallend.vect[1];
                      iVar18 = iVar3 * local_5b4.smallend.vect[1];
                      do {
                        if (local_5b4.smallend.vect[0] <= local_5b4.bigend.vect[0]) {
                          iVar15 = iVar2 * local_5b4.smallend.vect[0];
                          uVar23 = local_5b4.smallend.vect[0];
                          do {
                            if (0 < (int)uVar20) {
                              lVar13 = 0;
                              uVar21 = 0;
                              do {
                                if (iVar19 * iVar4 < (iVar19 + 1) * iVar4) {
                                  lVar17 = (long)local_508.p +
                                           (lVar12 - local_508.begin.z) * local_508.kstride * 8 +
                                           ((long)iVar18 - (long)local_508.begin.y) *
                                           local_508.jstride * 8 + (long)local_508.begin.x * -8 +
                                           (long)iVar15 * 8;
                                  lVar29 = local_618._0_8_ +
                                           local_600 * lVar13 +
                                           (lVar12 - aDStack_5f8[0].z) * local_618._16_8_ * 8 +
                                           ((long)iVar18 - (long)aDStack_5f8[0].y) * local_618._8_8_
                                           * 8 + (long)aDStack_5f8[0].x * -8 + (long)iVar15 * 8;
                                  dVar34 = 0.0;
                                  dVar33 = 0.0;
                                  lVar28 = lVar12;
                                  do {
                                    if ((int)(uVar23 * iVar2) < (int)((uVar23 + 1) * iVar2)) {
                                      lVar27 = 0;
                                      do {
                                        dVar1 = *(double *)(lVar17 + lVar27 * 8);
                                        dVar33 = dVar33 + *(double *)(lVar29 + lVar27 * 8) * dVar1;
                                        dVar34 = dVar34 + dVar1;
                                        lVar27 = lVar27 + 1;
                                      } while (iVar2 != (int)lVar27);
                                    }
                                    lVar28 = lVar28 + 1;
                                    lVar17 = lVar17 + local_508.kstride * 8;
                                    lVar29 = lVar29 + local_618._16_8_ * 8;
                                  } while (iVar24 != (int)lVar28);
                                  uVar20 = local_5d8;
                                  if (dVar34 <= 1e-30) goto LAB_005d2ebe;
                                  dVar33 = dVar33 / dVar34;
                                }
                                else {
LAB_005d2ebe:
                                  dVar33 = *(double *)
                                            (local_618._0_8_ +
                                            (((long)(int)(uVar16 * iVar3) - (long)aDStack_5f8[0].y)
                                             * local_618._8_8_ +
                                            ((long)(int)(uVar23 * iVar2) - (long)aDStack_5f8[0].x) +
                                            ((long)(iVar19 * iVar4) - (long)aDStack_5f8[0].z) *
                                            local_618._16_8_ + local_600 * uVar21) * 8);
                                }
                                *(double *)
                                 (((long)(int)uVar16 - (long)(int)local_574) *
                                  CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                  result.smallend.vect._0_8_ +
                                  ((long)(int)uVar23 - (long)(int)local_578) * 8 +
                                  ((long)iVar19 - (long)(int)local_570) *
                                  CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                 CONCAT44(uStack_57c,result.btype.itype) * uVar21 * 8) = dVar33;
                                uVar21 = uVar21 + 1;
                                lVar13 = lVar13 + 8;
                              } while (uVar21 != uVar20);
                            }
                            uVar23 = uVar23 + 1;
                            iVar15 = iVar15 + iVar2;
                          } while (uVar23 != local_5b4.bigend.vect[0] + 1U);
                        }
                        iVar18 = iVar18 + iVar3;
                        bVar9 = uVar16 != local_5b4.bigend.vect[1];
                        uVar16 = uVar16 + 1;
                      } while (bVar9);
                    }
                    iVar19 = iVar19 + 1;
                    iVar31 = iVar31 + iVar4;
                    iVar24 = iVar24 + iVar4;
                  } while (iVar19 != local_5b4.bigend.vect[2] + 1);
                }
              }
              else if (iVar19 == 0) {
                if (local_5b4.smallend.vect[2] <= local_5b4.bigend.vect[2]) {
                  local_5c0 = (ulong)(uint)local_5b4.bigend.vect[1];
                  iVar31 = iVar4 * local_5b4.smallend.vect[2];
                  iVar24 = (local_5b4.smallend.vect[2] + 1) * iVar4;
                  iVar19 = local_5b4.smallend.vect[2];
                  do {
                    lVar12 = (long)iVar31;
                    if (local_5b4.smallend.vect[1] <= local_5b4.bigend.vect[1]) {
                      iVar18 = iVar3 * local_5b4.smallend.vect[1];
                      uVar16 = local_5b4.smallend.vect[1];
                      do {
                        if (local_5b4.smallend.vect[0] <= local_5b4.bigend.vect[0]) {
                          uVar23 = local_5b4.smallend.vect[0];
                          iVar15 = iVar2 * local_5b4.smallend.vect[0];
                          do {
                            if (0 < (int)uVar20) {
                              lVar13 = 0;
                              uVar21 = 0;
                              do {
                                if (iVar19 * iVar4 < (iVar19 + 1) * iVar4) {
                                  pdVar32 = (double *)
                                            ((long)local_508.p +
                                            ((long)iVar18 - (long)local_508.begin.y) *
                                            local_508.jstride * 8 +
                                            (lVar12 - local_508.begin.z) * local_508.kstride * 8 +
                                            (long)local_508.begin.x * -8 + (long)iVar15 * 8);
                                  pdVar14 = (double *)
                                            (local_618._0_8_ +
                                            local_600 * lVar13 +
                                            ((long)iVar18 - (long)aDStack_5f8[0].y) *
                                            local_618._8_8_ * 8 +
                                            (lVar12 - aDStack_5f8[0].z) * local_618._16_8_ * 8 +
                                            (long)aDStack_5f8[0].x * -8 + (long)iVar15 * 8);
                                  dVar34 = 0.0;
                                  dVar33 = 0.0;
                                  lVar28 = lVar12;
                                  do {
                                    pdVar22 = pdVar14;
                                    pdVar25 = pdVar32;
                                    iVar26 = iVar3;
                                    if ((int)(uVar16 * iVar3) < (int)((uVar16 + 1) * iVar3)) {
                                      do {
                                        dVar33 = dVar33 + *pdVar22 * *pdVar25;
                                        dVar34 = dVar34 + *pdVar25;
                                        pdVar25 = pdVar25 + local_508.jstride;
                                        pdVar22 = pdVar22 + local_618._8_8_;
                                        iVar26 = iVar26 + -1;
                                      } while (iVar26 != 0);
                                    }
                                    lVar28 = lVar28 + 1;
                                    pdVar32 = pdVar32 + local_508.kstride;
                                    pdVar14 = pdVar14 + local_618._16_8_;
                                  } while (iVar24 != (int)lVar28);
                                  uVar20 = local_5d8;
                                  if (dVar34 <= 1e-30) goto LAB_005d2a81;
                                  dVar33 = dVar33 / dVar34;
                                }
                                else {
LAB_005d2a81:
                                  dVar33 = *(double *)
                                            (local_618._0_8_ +
                                            (((long)(int)(uVar16 * iVar3) - (long)aDStack_5f8[0].y)
                                             * local_618._8_8_ +
                                            ((long)(int)(uVar23 * iVar2) - (long)aDStack_5f8[0].x) +
                                            ((long)(iVar19 * iVar4) - (long)aDStack_5f8[0].z) *
                                            local_618._16_8_ + local_600 * uVar21) * 8);
                                }
                                *(double *)
                                 (((long)(int)uVar16 - (long)(int)local_574) *
                                  CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                  result.smallend.vect._0_8_ +
                                  ((long)(int)uVar23 - (long)(int)local_578) * 8 +
                                  ((long)iVar19 - (long)(int)local_570) *
                                  CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                 CONCAT44(uStack_57c,result.btype.itype) * uVar21 * 8) = dVar33;
                                uVar21 = uVar21 + 1;
                                lVar13 = lVar13 + 8;
                              } while (uVar21 != uVar20);
                            }
                            iVar15 = iVar15 + iVar2;
                            bVar9 = uVar23 != local_5b4.bigend.vect[0];
                            uVar23 = uVar23 + 1;
                          } while (bVar9);
                        }
                        uVar16 = uVar16 + 1;
                        iVar18 = iVar18 + iVar3;
                      } while (uVar16 != local_5b4.bigend.vect[1] + 1U);
                    }
                    iVar19 = iVar19 + 1;
                    iVar31 = iVar31 + iVar4;
                    iVar24 = iVar24 + iVar4;
                  } while (iVar19 != local_5b4.bigend.vect[2] + 1);
                }
              }
              else if (local_5b4.smallend.vect[2] <= local_5b4.bigend.vect[2]) {
                local_640 = iVar4 * local_5b4.smallend.vect[2];
                iVar19 = local_5b4.smallend.vect[2];
                do {
                  if (local_5b4.smallend.vect[1] <= local_5b4.bigend.vect[1]) {
                    iVar31 = iVar3 * local_5b4.smallend.vect[1];
                    iVar24 = (local_5b4.smallend.vect[1] + 1U) * iVar3;
                    uVar16 = local_5b4.smallend.vect[1];
                    do {
                      lVar12 = (long)iVar31;
                      if (local_5b4.smallend.vect[0] <= local_5b4.bigend.vect[0]) {
                        local_5c0 = CONCAT44(local_5c0._4_4_,uVar16 + 1);
                        iVar18 = iVar2 * local_5b4.smallend.vect[0];
                        uVar23 = local_5b4.smallend.vect[0];
                        do {
                          if (0 < (int)uVar20) {
                            lVar13 = 0;
                            uVar21 = 0;
                            do {
                              if ((int)(uVar16 * iVar3) < (int)((uVar16 + 1) * iVar3)) {
                                lVar17 = (long)local_508.p +
                                         (lVar12 - local_508.begin.y) * local_508.jstride * 8 +
                                         ((long)local_640 - (long)local_508.begin.z) *
                                         local_508.kstride * 8 + (long)local_508.begin.x * -8 +
                                         (long)iVar18 * 8;
                                lVar29 = local_618._0_8_ +
                                         local_600 * lVar13 +
                                         (lVar12 - aDStack_5f8[0].y) * local_618._8_8_ * 8 +
                                         ((long)local_640 - (long)aDStack_5f8[0].z) *
                                         local_618._16_8_ * 8 + (long)aDStack_5f8[0].x * -8 +
                                         (long)iVar18 * 8;
                                dVar34 = 0.0;
                                dVar33 = 0.0;
                                lVar28 = lVar12;
                                do {
                                  if ((int)(uVar23 * iVar2) < (int)((uVar23 + 1) * iVar2)) {
                                    lVar27 = 0;
                                    do {
                                      dVar1 = *(double *)(lVar17 + lVar27 * 8);
                                      dVar33 = dVar33 + *(double *)(lVar29 + lVar27 * 8) * dVar1;
                                      dVar34 = dVar34 + dVar1;
                                      lVar27 = lVar27 + 1;
                                    } while (iVar2 != (int)lVar27);
                                  }
                                  lVar28 = lVar28 + 1;
                                  lVar17 = lVar17 + local_508.jstride * 8;
                                  lVar29 = lVar29 + local_618._8_8_ * 8;
                                } while (iVar24 != (int)lVar28);
                                uVar20 = local_5d8;
                                if (dVar34 <= 1e-30) goto LAB_005d330b;
                                dVar33 = dVar33 / dVar34;
                              }
                              else {
LAB_005d330b:
                                dVar33 = *(double *)
                                          (local_618._0_8_ +
                                          (((long)(int)(uVar16 * iVar3) - (long)aDStack_5f8[0].y) *
                                           local_618._8_8_ +
                                          ((long)(int)(uVar23 * iVar2) - (long)aDStack_5f8[0].x) +
                                          ((long)(iVar19 * iVar4) - (long)aDStack_5f8[0].z) *
                                          local_618._16_8_ + local_600 * uVar21) * 8);
                              }
                              *(double *)
                               (((long)(int)uVar16 - (long)(int)local_574) *
                                CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                result.smallend.vect._0_8_ +
                                ((long)(int)uVar23 - (long)(int)local_578) * 8 +
                                ((long)iVar19 - (long)(int)local_570) *
                                CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                               CONCAT44(uStack_57c,result.btype.itype) * uVar21 * 8) = dVar33;
                              uVar21 = uVar21 + 1;
                              lVar13 = lVar13 + 8;
                            } while (uVar21 != uVar20);
                          }
                          uVar23 = uVar23 + 1;
                          iVar18 = iVar18 + iVar2;
                        } while (uVar23 != local_5b4.bigend.vect[0] + 1U);
                      }
                      uVar16 = uVar16 + 1;
                      iVar31 = iVar31 + iVar3;
                      iVar24 = iVar24 + iVar3;
                    } while (uVar16 != local_5b4.bigend.vect[1] + 1U);
                  }
                  local_640 = local_640 + iVar4;
                  bVar9 = iVar19 != local_5b4.bigend.vect[2];
                  iVar19 = iVar19 + 1;
                } while (bVar9);
              }
            }
            MFIter::operator++(&mfi);
          }
          MFIter::~MFIter(&mfi);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
      }
      else {
        lVar11 = 0;
        do {
          MultiFab::MultiFab((MultiFab *)((long)mfi.tile_size.vect + lVar11 + -0x10));
          lVar11 = lVar11 + 0x180;
        } while (lVar11 != 0x480);
        pMVar30 = &mfi;
        lVar11 = 0;
        do {
          BoxArray::BoxArray((BoxArray *)&result,
                             &(local_5d0->_M_elems[lVar11]->super_FabArray<amrex::FArrayBox>).
                              super_FabArrayBase.boxarray);
          BoxArray::coarsen((BoxArray *)&result,local_5c8);
          local_618._0_8_ = (double *)0x1;
          local_600 = 0;
          aDStack_5f8[0].x = 0;
          aDStack_5f8[0].y = 0;
          local_618._8_8_ = 0;
          local_618._16_8_ = 0;
          local_508.p = (double *)&PTR__FabFactory_0080b918;
          (**(code **)((long)&((pMVar30->m_fa)._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                              boxarray + 8))
                    (pMVar30,(BoxArray *)&result,
                     &(local_5d0->_M_elems[lVar11]->super_FabArray<amrex::FArrayBox>).
                      super_FabArrayBase.distributionMap,local_5d8,ngcrse,local_618,&local_508);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_618 + 0x10));
          BoxArray::~BoxArray((BoxArray *)&result);
          lVar11 = lVar11 + 1;
          pMVar30 = pMVar30 + 4;
        } while (lVar11 != 3);
        src = (FabArray<amrex::FArrayBox> *)&mfi;
        result._8_8_ = local_330;
        result.bigend.vect._4_8_ = local_1b0;
        result.smallend.vect._0_8_ = src;
        EB_average_down_faces(local_5d0,(Array<MultiFab_*,_3> *)&result,local_5c8,ngcrse);
        lVar11 = 0;
        do {
          this = &crse->_M_elems[lVar11]->super_FabArray<amrex::FArrayBox>;
          period = Periodicity::NonPeriodic();
          result.smallend.vect[1] = ngcrse;
          result.smallend.vect[0] = ngcrse;
          local_618._4_4_ = ngcrse;
          local_618._0_4_ = ngcrse;
          local_618._8_4_ = ngcrse;
          result.smallend.vect[2] = ngcrse;
          FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                    (this,src,0,0,(int)local_5d8,&result.smallend,(IntVect *)local_618,period,COPY,
                     (CPC *)0x0,false);
          lVar11 = lVar11 + 1;
          src = src + 1;
        } while (lVar11 != 3);
        lVar11 = 0x300;
        do {
          MultiFab::~MultiFab((MultiFab *)((long)mfi.tile_size.vect + lVar11 + -0x10));
          lVar11 = lVar11 + -0x180;
        } while (lVar11 != -0x180);
      }
      return;
    }
  }
  average_down_faces(local_5d0,crse,local_5c8,ngcrse);
  return;
}

Assistant:

void EB_average_down_faces (const Array<const MultiFab*,AMREX_SPACEDIM>& fine,
                            const Array<MultiFab*,AMREX_SPACEDIM>& crse,
                            const IntVect& ratio, int ngcrse)
{
    AMREX_ASSERT(crse[0]->nComp() == fine[0]->nComp());

    int ncomp = crse[0]->nComp();
    if (!(*fine[0]).hasEBFabFactory())
    {
        amrex::average_down_faces(fine, crse, ratio, ngcrse);
    }
    else
    {
        Dim3 dratio = ratio.dim3();

        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>((*fine[0]).Factory());
        const auto&  aspect = factory.getAreaFrac();

        if (isMFIterSafe(*fine[0], *crse[0]))
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (int n=0; n<AMREX_SPACEDIM; ++n) {
                for (MFIter mfi(*crse[n],TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const auto& flag_fab = amrex::getEBCellFlagFab((*fine[n])[mfi]);
                    const Box& tbx = mfi.growntilebox(ngcrse);
                    FabType typ = flag_fab.getType(amrex::refine(tbx,ratio));

                    Array4<Real> const& ca = crse[n]->array(mfi);
                    Array4<Real const> const& fa = fine[n]->const_array(mfi);

                    if(typ == FabType::regular || typ == FabType::covered)
                    {
                        AMREX_LAUNCH_HOST_DEVICE_LAMBDA(tbx, b,
                        {
                            amrex_avgdown_faces(b, ca, fa, 0, 0, ncomp, ratio, n);
                        });
                    }
                    else
                    {
                        Array4<Real const> const& ap = aspect[n]->const_array(mfi);
                        if (n == 0) {
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_x(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
                        } else if (n == 1) {
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_y(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
                        } else {
#if (AMREX_SPACEDIM == 3)
                            AMREX_HOST_DEVICE_FOR_3D(tbx,i,j,k,
                            {
                                eb_avgdown_face_z(i,j,k,fa,0,ca,0,ap,dratio,ncomp);
                            });
#endif
                        }
                    }
                }
            }
        }
        else
        {
            Array<MultiFab,AMREX_SPACEDIM> ctmp;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                BoxArray cba = fine[idim]->boxArray();
                cba.coarsen(ratio);
                ctmp[idim].define(cba, fine[idim]->DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            }
            EB_average_down_faces(fine, amrex::GetArrOfPtrs(ctmp), ratio, ngcrse);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                crse[idim]->ParallelCopy(ctmp[idim],0,0,ncomp,ngcrse,ngcrse);
            }
        }
    }
}